

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O1

ssize_t __thiscall IniProcessing::read(IniProcessing *this,int __fd,void *__buf,size_t __nbytes)

{
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Var1;
  undefined1 uVar2;
  undefined4 in_register_00000034;
  bool ok;
  bool local_19;
  
  uVar2 = (undefined1)__nbytes;
  local_19 = false;
  _Var1._M_cur = (__node_type *)
                 IniProcessing_readHelper_abi_cxx11_
                           (this,(char *)CONCAT44(in_register_00000034,__fd),&local_19);
  if ((local_19 == true) && (*(long *)((long)_Var1._M_cur + 0x30) != 0)) {
    _Var1._M_cur = *(__node_type **)((long)_Var1._M_cur + 0x28);
    uVar2 = *(undefined1 *)&((_Var1._M_cur)->super__Hash_node_base)._M_nxt;
  }
  *(undefined1 *)__buf = uVar2;
  return (ssize_t)_Var1._M_cur;
}

Assistant:

void IniProcessing::read(const char *key, unsigned char &dest, unsigned char defVal)
{
    bool ok = false;
    params::IniKeys::iterator e = IniProcessing_readHelper(this, key, ok);

    if(!ok)
    {
        dest = defVal;
        return;
    }

    std::string &k = e->second;

    if(k.size() >= 1)
        dest = static_cast<unsigned char>(k[0]);
    else
        dest = defVal;
}